

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IO.h
# Opt level: O0

uint64_t nanovdb::io::reverseEndianness(uint64_t val)

{
  uint64_t val_local;
  
  return val >> 0x38 | val >> 0x28 & 0xff00 | val >> 0x18 & 0xff0000 | val >> 8 & 0xff000000 |
         (val & 0xff000000) << 8 | (val & 0xff0000) << 0x18 | (val & 0xff00) << 0x28 | val << 0x38;
}

Assistant:

inline uint64_t reverseEndianness(uint64_t val)
{
    return (((val) >> 56) & 0x00000000000000FF) | (((val) >> 40) & 0x000000000000FF00) |
           (((val) >> 24) & 0x0000000000FF0000) | (((val) >> 8) & 0x00000000FF000000) |
           (((val) << 8) & 0x000000FF00000000) | (((val) << 24) & 0x0000FF0000000000) |
           (((val) << 40) & 0x00FF000000000000) | (((val) << 56) & 0xFF00000000000000);
}